

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O0

int uv__fs_statx(int fd,char *path,int is_fstat,int is_lstat,uv_stat_t *buf)

{
  int iVar1;
  int *piVar2;
  ulonglong uVar3;
  int rc;
  int mode;
  int flags;
  int dirfd;
  uv__statx statxbuf;
  uv_stat_t *buf_local;
  int is_lstat_local;
  int is_fstat_local;
  char *path_local;
  int fd_local;
  
  if (uv__fs_statx::no_statx == 0) {
    mode = -100;
    rc = 0;
    if (is_fstat != 0) {
      rc = 0x1000;
      mode = fd;
    }
    if (is_lstat != 0) {
      rc = rc | 0x100;
    }
    statxbuf.unused1[0xd] = (uint64_t)buf;
    iVar1 = uv__statx(mode,path,rc,0xfff,(uv__statx *)&flags);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      if ((((*piVar2 != 0x16) && (piVar2 = __errno_location(), *piVar2 != 1)) &&
          (piVar2 = __errno_location(), *piVar2 != 0x26)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x5f)) {
        return -1;
      }
    }
    else if (iVar1 == 0) {
      uVar3 = gnu_dev_makedev(statxbuf.stx_rdev_major,statxbuf.stx_rdev_minor);
      *(ulonglong *)statxbuf.unused1[0xd] = uVar3;
      *(ulong *)(statxbuf.unused1[0xd] + 8) = (ulong)(ushort)statxbuf.stx_uid;
      *(ulong *)(statxbuf.unused1[0xd] + 0x10) = (ulong)(uint)statxbuf.stx_attributes;
      *(ulong *)(statxbuf.unused1[0xd] + 0x18) = (ulong)statxbuf.stx_attributes._4_4_;
      *(ulong *)(statxbuf.unused1[0xd] + 0x20) = (ulong)statxbuf.stx_nlink;
      uVar3 = gnu_dev_makedev(statxbuf.stx_mtime.tv_nsec,statxbuf.stx_mtime.unused0);
      *(ulonglong *)(statxbuf.unused1[0xd] + 0x28) = uVar3;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x30) = statxbuf._24_8_;
      *(uint64_t *)(statxbuf.unused1[0xd] + 0x38) = statxbuf.stx_ino;
      *(ulong *)(statxbuf.unused1[0xd] + 0x40) = (ulong)(uint)dirfd;
      *(uint64_t *)(statxbuf.unused1[0xd] + 0x48) = statxbuf.stx_size;
      *(uint64_t *)(statxbuf.unused1[0xd] + 0x60) = statxbuf.stx_attributes_mask;
      *(ulong *)(statxbuf.unused1[0xd] + 0x68) = (ulong)(uint)statxbuf.stx_atime.tv_sec;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x70) = statxbuf.stx_ctime._8_8_;
      *(ulong *)(statxbuf.unused1[0xd] + 0x78) = (ulong)(uint)statxbuf.stx_mtime.tv_sec;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x80) = statxbuf.stx_btime._8_8_;
      *(ulong *)(statxbuf.unused1[0xd] + 0x88) = (ulong)(uint)statxbuf.stx_ctime.tv_sec;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x90) = statxbuf.stx_atime._8_8_;
      *(ulong *)(statxbuf.unused1[0xd] + 0x98) = (ulong)(uint)statxbuf.stx_btime.tv_sec;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x50) = 0;
      *(undefined8 *)(statxbuf.unused1[0xd] + 0x58) = 0;
      return 0;
    }
    uv__fs_statx::no_statx = 1;
  }
  return -0x26;
}

Assistant:

static int uv__fs_statx(int fd,
                        const char* path,
                        int is_fstat,
                        int is_lstat,
                        uv_stat_t* buf) {
  STATIC_ASSERT(UV_ENOSYS != -1);
#ifdef __linux__
  static int no_statx;
  struct uv__statx statxbuf;
  int dirfd;
  int flags;
  int mode;
  int rc;

  if (uv__load_relaxed(&no_statx))
    return UV_ENOSYS;

  dirfd = AT_FDCWD;
  flags = 0; /* AT_STATX_SYNC_AS_STAT */
  mode = 0xFFF; /* STATX_BASIC_STATS + STATX_BTIME */

  if (is_fstat) {
    dirfd = fd;
    flags |= 0x1000; /* AT_EMPTY_PATH */
  }

  if (is_lstat)
    flags |= AT_SYMLINK_NOFOLLOW;

  rc = uv__statx(dirfd, path, flags, mode, &statxbuf);

  switch (rc) {
  case 0:
    break;
  case -1:
    /* EPERM happens when a seccomp filter rejects the system call.
     * Has been observed with libseccomp < 2.3.3 and docker < 18.04.
     * EOPNOTSUPP is used on DVS exported filesystems
     */
    if (errno != EINVAL && errno != EPERM && errno != ENOSYS && errno != EOPNOTSUPP)
      return -1;
    /* Fall through. */
  default:
    /* Normally on success, zero is returned and On error, -1 is returned.
     * Observed on S390 RHEL running in a docker container with statx not
     * implemented, rc might return 1 with 0 set as the error code in which
     * case we return ENOSYS.
     */
    uv__store_relaxed(&no_statx, 1);
    return UV_ENOSYS;
  }

  buf->st_dev = makedev(statxbuf.stx_dev_major, statxbuf.stx_dev_minor);
  buf->st_mode = statxbuf.stx_mode;
  buf->st_nlink = statxbuf.stx_nlink;
  buf->st_uid = statxbuf.stx_uid;
  buf->st_gid = statxbuf.stx_gid;
  buf->st_rdev = makedev(statxbuf.stx_rdev_major, statxbuf.stx_rdev_minor);
  buf->st_ino = statxbuf.stx_ino;
  buf->st_size = statxbuf.stx_size;
  buf->st_blksize = statxbuf.stx_blksize;
  buf->st_blocks = statxbuf.stx_blocks;
  buf->st_atim.tv_sec = statxbuf.stx_atime.tv_sec;
  buf->st_atim.tv_nsec = statxbuf.stx_atime.tv_nsec;
  buf->st_mtim.tv_sec = statxbuf.stx_mtime.tv_sec;
  buf->st_mtim.tv_nsec = statxbuf.stx_mtime.tv_nsec;
  buf->st_ctim.tv_sec = statxbuf.stx_ctime.tv_sec;
  buf->st_ctim.tv_nsec = statxbuf.stx_ctime.tv_nsec;
  buf->st_birthtim.tv_sec = statxbuf.stx_btime.tv_sec;
  buf->st_birthtim.tv_nsec = statxbuf.stx_btime.tv_nsec;
  buf->st_flags = 0;
  buf->st_gen = 0;

  return 0;
#else
  return UV_ENOSYS;
#endif /* __linux__ */
}